

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O3

ProgramContext * __thiscall
deqp::gles2::Performance::ShaderCompilerLightCase::generateShaderData
          (ProgramContext *__return_storage_ptr__,ShaderCompilerLightCase *this,int measurementNdx)

{
  float *pfVar1;
  size_type sVar2;
  undefined8 uVar3;
  uint uVar4;
  long *plVar5;
  undefined1 *puVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  int row;
  pointer pAVar8;
  size_type *psVar9;
  long lVar10;
  long lVar11;
  string *psVar12;
  long lVar13;
  uint cacheAvoidanceID;
  int iVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  LightType in_R8D;
  undefined1 auVar16 [16];
  bool bVar18;
  undefined4 uVar19;
  Array<float,_16> a_1;
  Array<float,_16> a_3;
  Vector<float,_16> result;
  string nameSpec;
  Array<float,_9> a_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined1 local_318 [32];
  float local_2f8;
  float fStack_2f4;
  undefined8 uStack_2f0;
  float local_2e8;
  float fStack_2e4;
  undefined8 uStack_2e0;
  string local_2d8;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  int local_20c;
  UniformSpec local_208;
  ios_base local_198 [268];
  LightType local_8c;
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined4 local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long lVar17;
  
  cacheAvoidanceID = (this->super_ShaderCompilerCase).m_startHash;
  if ((this->super_ShaderCompilerCase).m_avoidCache == true) {
    uVar4 = ((uint)measurementNdx >> 0x10 ^ measurementNdx ^ 0x3d) * 9;
    uVar4 = (uVar4 >> 4 ^ uVar4) * 0x27d4eb2d;
    cacheAvoidanceID = cacheAvoidanceID ^ uVar4 ^ uVar4 >> 0xf;
  }
  getNameSpecialization_abi_cxx11_(&local_278,(Performance *)(ulong)cacheAvoidanceID,measurementNdx)
  ;
  (__return_storage_ptr__->vertShaderSource)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->vertShaderSource).field_2;
  (__return_storage_ptr__->vertShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->vertShaderSource).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->fragShaderSource)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->fragShaderSource).field_2;
  (__return_storage_ptr__->fragShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->fragShaderSource).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lightVertexTemplate_abi_cxx11_
            (&local_2d8,(Performance *)(ulong)(uint)this->m_numLights,(uint)this->m_isVertexCase,
             SUB41(this->m_lightType,0),in_R8D);
  specializeShaderSource(&local_208.name,&local_2d8,cacheAvoidanceID,SHADER_VALIDITY_VALID);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.name._M_dataplus._M_p != &local_208.name.field_2) {
    operator_delete(local_208.name._M_dataplus._M_p,local_208.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  lightFragmentTemplate_abi_cxx11_
            (&local_2d8,(Performance *)(ulong)(uint)this->m_numLights,(uint)this->m_isVertexCase,
             SUB41(this->m_lightType,0),in_R8D);
  psVar12 = &local_2d8;
  specializeShaderSource(&local_208.name,psVar12,cacheAvoidanceID,SHADER_VALIDITY_VALID);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->fragShaderSource,(string *)&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.name._M_dataplus._M_p != &local_208.name.field_2) {
    operator_delete(local_208.name._M_dataplus._M_p,local_208.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  local_318._0_8_ = (pointer)0x0;
  local_318._8_8_ = (pointer)0x0;
  local_318._16_8_ = (pointer)0x0;
  std::operator+(&local_358,"a_position",&local_278);
  local_258._M_dataplus._M_p = (pointer)0xbf800000bf800000;
  local_258._M_string_length = 0x3f80000000000000;
  local_88._8_8_ = 0x3f80000000000000;
  local_88._0_8_ = 0x3f800000bf800000;
  local_58._M_dataplus._M_p = (pointer)0xbf8000003f800000;
  local_58._M_string_length = 0x3f80000000000000;
  local_298._M_dataplus._M_p = (pointer)0x3f8000003f800000;
  local_298._M_string_length = 0x3f80000000000000;
  local_2d8._M_dataplus._M_p = (pointer)0x0;
  local_2d8._M_string_length = 0;
  local_2d8.field_2._M_allocated_capacity = 0;
  local_2d8.field_2._8_8_ = 0;
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_2a8 = 0;
  uStack_2a0 = 0;
  lVar11 = 0;
  do {
    iVar14 = (int)lVar11;
    pbVar7 = &local_258;
    if (((iVar14 != 0) &&
        (pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
        iVar14 != 1)) && (pbVar7 = &local_298, iVar14 == 2)) {
      pbVar7 = &local_58;
    }
    sVar2 = pbVar7->_M_string_length;
    (psVar12->_M_dataplus)._M_p = (pbVar7->_M_dataplus)._M_p;
    psVar12->_M_string_length = sVar2;
    lVar11 = lVar11 + 1;
    psVar12 = (string *)&psVar12->field_2;
  } while (lVar11 != 4);
  local_208.name._M_dataplus._M_p = (pointer)&local_208.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_358._M_dataplus._M_p,
             local_358._M_dataplus._M_p + local_358._M_string_length);
  local_208.value.m_data[0xb] = (float)local_2a8;
  local_208.value.m_data[0xc] = (float)((ulong)local_2a8 >> 0x20);
  local_208.value.m_data[0xd] = (float)uStack_2a0;
  local_208.value.m_data[0xe] = (float)((ulong)uStack_2a0 >> 0x20);
  local_208.value.m_data[7] = (float)local_2b8;
  local_208.value.m_data[8] = (float)((ulong)local_2b8 >> 0x20);
  local_208.value.m_data[9] = (float)uStack_2b0;
  local_208.value.m_data[10] = (float)((ulong)uStack_2b0 >> 0x20);
  local_208.value.m_data[3] = (float)local_2d8.field_2._M_allocated_capacity;
  local_208.value.m_data[4] = (float)((ulong)local_2d8.field_2._0_8_ >> 0x20);
  local_208.value.m_data[5] = (float)local_2d8.field_2._8_8_;
  local_208.value.m_data[6] = (float)((ulong)local_2d8.field_2._8_8_ >> 0x20);
  local_208.type = (Type)local_2d8._M_dataplus._M_p;
  local_208.value.m_data[0] = (float)((ulong)local_2d8._M_dataplus._M_p >> 0x20);
  local_208.value.m_data[1] = (float)local_2d8._M_string_length;
  local_208.value.m_data[2] = (float)(local_2d8._M_string_length >> 0x20);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
              *)local_318,(AttribSpec *)&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.name._M_dataplus._M_p != &local_208.name.field_2) {
    operator_delete(local_208.name._M_dataplus._M_p,local_208.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_358,"a_normal",&local_278);
  local_258._M_dataplus._M_p = (pointer)0x0;
  local_258._M_string_length = 0xbf800000;
  local_88 = ZEXT816(0xbf800000) << 0x40;
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0xbf800000;
  local_298._M_dataplus._M_p = (pointer)0x0;
  local_298._M_string_length = 0xbf800000;
  psVar12 = &local_2d8;
  local_2d8._M_dataplus._M_p = (pointer)0x0;
  local_2d8._M_string_length = 0;
  local_2d8.field_2._M_allocated_capacity = 0;
  local_2d8.field_2._8_8_ = 0;
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_2a8 = 0;
  uStack_2a0 = 0;
  lVar11 = 0;
  do {
    iVar14 = (int)lVar11;
    pbVar7 = &local_258;
    if (((iVar14 != 0) &&
        (pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
        iVar14 != 1)) && (pbVar7 = &local_298, iVar14 == 2)) {
      pbVar7 = &local_58;
    }
    sVar2 = pbVar7->_M_string_length;
    (psVar12->_M_dataplus)._M_p = (pbVar7->_M_dataplus)._M_p;
    psVar12->_M_string_length = sVar2;
    lVar11 = lVar11 + 1;
    psVar12 = (string *)&psVar12->field_2;
  } while (lVar11 != 4);
  local_208.name._M_dataplus._M_p = (pointer)&local_208.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_358._M_dataplus._M_p,
             local_358._M_dataplus._M_p + local_358._M_string_length);
  local_208.value.m_data[0xb] = (float)local_2a8;
  local_208.value.m_data[0xc] = (float)((ulong)local_2a8 >> 0x20);
  local_208.value.m_data[0xd] = (float)uStack_2a0;
  local_208.value.m_data[0xe] = (float)((ulong)uStack_2a0 >> 0x20);
  local_208.value.m_data[7] = (float)local_2b8;
  local_208.value.m_data[8] = (float)((ulong)local_2b8 >> 0x20);
  local_208.value.m_data[9] = (float)uStack_2b0;
  local_208.value.m_data[10] = (float)((ulong)uStack_2b0 >> 0x20);
  local_208.value.m_data[3] = (float)local_2d8.field_2._M_allocated_capacity;
  local_208.value.m_data[4] = (float)((ulong)local_2d8.field_2._0_8_ >> 0x20);
  local_208.value.m_data[5] = (float)local_2d8.field_2._8_8_;
  local_208.value.m_data[6] = (float)((ulong)local_2d8.field_2._8_8_ >> 0x20);
  local_208.type = (Type)local_2d8._M_dataplus._M_p;
  local_208.value.m_data[0] = (float)((ulong)local_2d8._M_dataplus._M_p >> 0x20);
  local_208.value.m_data[1] = (float)local_2d8._M_string_length;
  local_208.value.m_data[2] = (float)(local_2d8._M_string_length >> 0x20);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
              *)local_318,(AttribSpec *)&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.name._M_dataplus._M_p != &local_208.name.field_2) {
    operator_delete(local_208.name._M_dataplus._M_p,local_208.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  pbVar7 = &local_358;
  std::operator+(pbVar7,"a_texCoord0",&local_278);
  local_258._M_dataplus._M_p = (pointer)0x0;
  local_258._M_string_length = 0;
  local_88._0_12_ = ZEXT812(0x3f800000);
  local_88._12_4_ = 0;
  local_58._M_dataplus._M_p = (pointer)0x3f80000000000000;
  local_58._M_string_length = 0;
  local_298._M_dataplus._M_p = (pointer)0x3f8000003f800000;
  local_298._M_string_length = 0;
  psVar12 = &local_2d8;
  local_2d8._M_dataplus._M_p = (pointer)0x0;
  local_2d8._M_string_length = 0;
  local_2d8.field_2._M_allocated_capacity = 0;
  local_2d8.field_2._8_8_ = 0;
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_2a8 = 0;
  uStack_2a0 = 0;
  lVar11 = 0;
  do {
    iVar14 = (int)lVar11;
    pbVar15 = &local_258;
    if (((iVar14 != 0) &&
        (pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
        iVar14 != 1)) && (pbVar15 = &local_298, iVar14 == 2)) {
      pbVar15 = &local_58;
    }
    sVar2 = pbVar15->_M_string_length;
    (psVar12->_M_dataplus)._M_p = (pbVar15->_M_dataplus)._M_p;
    psVar12->_M_string_length = sVar2;
    lVar11 = lVar11 + 1;
    psVar12 = (string *)&psVar12->field_2;
  } while (lVar11 != 4);
  local_208.name._M_dataplus._M_p = (pointer)&local_208.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_358._M_dataplus._M_p,
             local_358._M_dataplus._M_p + local_358._M_string_length);
  local_208.value.m_data[0xb] = (float)local_2a8;
  local_208.value.m_data[0xc] = (float)((ulong)local_2a8 >> 0x20);
  local_208.value.m_data[0xd] = (float)uStack_2a0;
  local_208.value.m_data[0xe] = (float)((ulong)uStack_2a0 >> 0x20);
  local_208.value.m_data[7] = (float)local_2b8;
  local_208.value.m_data[8] = (float)((ulong)local_2b8 >> 0x20);
  local_208.value.m_data[9] = (float)uStack_2b0;
  local_208.value.m_data[10] = (float)((ulong)uStack_2b0 >> 0x20);
  local_208.value.m_data[3] = (float)local_2d8.field_2._M_allocated_capacity;
  local_208.value.m_data[4] = (float)((ulong)local_2d8.field_2._0_8_ >> 0x20);
  local_208.value.m_data[5] = (float)local_2d8.field_2._8_8_;
  local_208.value.m_data[6] = (float)((ulong)local_2d8.field_2._8_8_ >> 0x20);
  local_208.type = (Type)local_2d8._M_dataplus._M_p;
  local_208.value.m_data[0] = (float)((ulong)local_2d8._M_dataplus._M_p >> 0x20);
  local_208.value.m_data[1] = (float)local_2d8._M_string_length;
  local_208.value.m_data[2] = (float)(local_2d8._M_string_length >> 0x20);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
              *)local_318,(AttribSpec *)&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.name._M_dataplus._M_p != &local_208.name.field_2) {
    operator_delete(local_208.name._M_dataplus._M_p,local_208.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  local_208.name.field_2._M_allocated_capacity =
       (size_type)
       (__return_storage_ptr__->vertexAttributes).
       super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_318._16_8_;
  local_208.name._M_dataplus._M_p =
       (pointer)(__return_storage_ptr__->vertexAttributes).
                super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_208.name._M_string_length =
       (size_type)
       (__return_storage_ptr__->vertexAttributes).
       super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_318._0_8_;
  (__return_storage_ptr__->vertexAttributes).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_318._8_8_;
  local_318._0_8_ = (pointer)0x0;
  local_318._8_8_ = (pointer)0x0;
  local_318._16_8_ = (pointer)0x0;
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::~vector((vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
             *)&local_208);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::~vector((vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
             *)local_318);
  local_20c = this->m_numLights;
  local_8c = this->m_lightType;
  local_298._M_dataplus._M_p = (pointer)0x0;
  local_298._M_string_length = 0;
  local_298.field_2._M_allocated_capacity = 0;
  std::operator+(&local_2d8,"u_material_ambientColor",&local_278);
  local_208.name._M_dataplus._M_p = (pointer)&local_208.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_2d8._M_dataplus._M_p,
             local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
  local_208.type = TYPE_VEC3;
  local_208.value.m_data[0] = 0.5;
  local_208.value.m_data[1] = 0.7;
  local_208.value.m_data[2] = 0.9;
  local_208.value.m_data[3] = 0.0;
  local_208.value.m_data[4] = 0.0;
  local_208.value.m_data[5] = 0.0;
  local_208.value.m_data[6] = 0.0;
  local_208.value.m_data[7] = 0.0;
  local_208.value.m_data[8] = 0.0;
  local_208.value.m_data[9] = 0.0;
  local_208.value.m_data[10] = 0.0;
  local_208.value.m_data[0xb] = 0.0;
  local_208.value.m_data[0xc] = 0.0;
  local_208.value.m_data[0xd] = 0.0;
  local_208.value.m_data[0xe] = 0.0;
  local_208.value.m_data[0xf] = 0.0;
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
              *)&local_298,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.name._M_dataplus._M_p != &local_208.name.field_2) {
    operator_delete(local_208.name._M_dataplus._M_p,
                    (ulong)(local_208.name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_2d8,"u_material_diffuseColor",&local_278);
  local_208.name._M_dataplus._M_p = (pointer)&local_208.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_2d8._M_dataplus._M_p,
             local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
  local_208.type = TYPE_VEC4;
  local_208.value.m_data[0] = 0.3;
  local_208.value.m_data[1] = 0.4;
  local_208.value.m_data[2] = 0.5;
  local_208.value.m_data[3] = 1.0;
  local_208.value.m_data[4] = 0.0;
  local_208.value.m_data[5] = 0.0;
  local_208.value.m_data[6] = 0.0;
  local_208.value.m_data[7] = 0.0;
  local_208.value.m_data[8] = 0.0;
  local_208.value.m_data[9] = 0.0;
  local_208.value.m_data[10] = 0.0;
  local_208.value.m_data[0xb] = 0.0;
  local_208.value.m_data[0xc] = 0.0;
  local_208.value.m_data[0xd] = 0.0;
  local_208.value.m_data[0xe] = 0.0;
  local_208.value.m_data[0xf] = 0.0;
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
              *)&local_298,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.name._M_dataplus._M_p != &local_208.name.field_2) {
    operator_delete(local_208.name._M_dataplus._M_p,
                    (ulong)(local_208.name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_2d8,"u_material_emissiveColor",&local_278);
  local_208.name._M_dataplus._M_p = (pointer)&local_208.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_2d8._M_dataplus._M_p,
             local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
  local_208.type = TYPE_VEC3;
  local_208.value.m_data[0] = 0.7;
  local_208.value.m_data[1] = 0.2;
  local_208.value.m_data[2] = 0.2;
  local_208.value.m_data[3] = 0.0;
  local_208.value.m_data[4] = 0.0;
  local_208.value.m_data[5] = 0.0;
  local_208.value.m_data[6] = 0.0;
  local_208.value.m_data[7] = 0.0;
  local_208.value.m_data[8] = 0.0;
  local_208.value.m_data[9] = 0.0;
  local_208.value.m_data[10] = 0.0;
  local_208.value.m_data[0xb] = 0.0;
  local_208.value.m_data[0xc] = 0.0;
  local_208.value.m_data[0xd] = 0.0;
  local_208.value.m_data[0xe] = 0.0;
  local_208.value.m_data[0xf] = 0.0;
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
              *)&local_298,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.name._M_dataplus._M_p != &local_208.name.field_2) {
    operator_delete(local_208.name._M_dataplus._M_p,
                    (ulong)(local_208.name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_2d8,"u_material_specularColor",&local_278);
  local_208.name._M_dataplus._M_p = (pointer)&local_208.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_2d8._M_dataplus._M_p,
             local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
  local_208.type = TYPE_VEC3;
  local_208.value.m_data[0] = 0.2;
  local_208.value.m_data[1] = 0.6;
  local_208.value.m_data[2] = 1.0;
  local_208.value.m_data[3] = 0.0;
  local_208.value.m_data[4] = 0.0;
  local_208.value.m_data[5] = 0.0;
  local_208.value.m_data[6] = 0.0;
  local_208.value.m_data[7] = 0.0;
  local_208.value.m_data[8] = 0.0;
  local_208.value.m_data[9] = 0.0;
  local_208.value.m_data[10] = 0.0;
  local_208.value.m_data[0xb] = 0.0;
  local_208.value.m_data[0xc] = 0.0;
  local_208.value.m_data[0xd] = 0.0;
  local_208.value.m_data[0xe] = 0.0;
  local_208.value.m_data[0xf] = 0.0;
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
              *)&local_298,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.name._M_dataplus._M_p != &local_208.name.field_2) {
    operator_delete(local_208.name._M_dataplus._M_p,
                    (ulong)(local_208.name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_2d8,"u_material_shininess",&local_278);
  local_208.name._M_dataplus._M_p = (pointer)&local_208.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_2d8._M_dataplus._M_p,
             local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
  local_208.type = TYPE_FLOAT;
  lVar11 = 9;
  do {
    pfVar1 = local_208.value.m_data + lVar11 + -9;
    pfVar1[0] = 0.8;
    pfVar1[1] = 0.8;
    pfVar1 = local_208.value.m_data + lVar11 + -7;
    pfVar1[0] = 0.8;
    pfVar1[1] = 0.8;
    lVar11 = lVar11 + 4;
  } while (lVar11 != 0x19);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
              *)&local_298,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.name._M_dataplus._M_p != &local_208.name.field_2) {
    operator_delete(local_208.name._M_dataplus._M_p,
                    (ulong)(local_208.name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if (0 < local_20c) {
    iVar14 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_208);
      std::ostream::operator<<(&local_208,iVar14);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_208);
      std::ios_base::~ios_base(local_198);
      std::operator+(&local_258,"u_light",&local_2d8);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_258);
      local_318._0_8_ = local_318 + 0x10;
      pAVar8 = (pointer)(plVar5 + 2);
      if ((pointer)*plVar5 == pAVar8) {
        local_318._16_8_ = (pAVar8->name)._M_dataplus._M_p;
        local_318._24_8_ = plVar5[3];
      }
      else {
        local_318._16_8_ = (pAVar8->name)._M_dataplus._M_p;
        local_318._0_8_ = (pointer)*plVar5;
      }
      local_318._8_8_ = plVar5[1];
      *plVar5 = (long)pAVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append(local_318,(ulong)local_278._M_dataplus._M_p);
      local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
      psVar9 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_358.field_2._M_allocated_capacity = *psVar9;
        local_358.field_2._8_8_ = plVar5[3];
      }
      else {
        local_358.field_2._M_allocated_capacity = *psVar9;
        local_358._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_358._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_208.name._M_dataplus._M_p = (pointer)&local_208.name.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_208,local_358._M_dataplus._M_p,
                 local_358._M_dataplus._M_p + local_358._M_string_length);
      local_208.type = TYPE_VEC3;
      local_208.value.m_data[0] = 0.8;
      local_208.value.m_data[1] = 0.6;
      local_208.value.m_data[2] = 0.3;
      local_208.value.m_data[0xb] = 0.0;
      local_208.value.m_data[0xc] = 0.0;
      local_208.value.m_data[0xd] = 0.0;
      local_208.value.m_data[0xe] = 0.0;
      local_208.value.m_data[7] = 0.0;
      local_208.value.m_data[8] = 0.0;
      local_208.value.m_data[9] = 0.0;
      local_208.value.m_data[10] = 0.0;
      local_208.value.m_data[3] = 0.0;
      local_208.value.m_data[4] = 0.0;
      local_208.value.m_data[5] = 0.0;
      local_208.value.m_data[6] = 0.0;
      local_208.value.m_data[0xf] = 0.0;
      std::
      vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
      ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
                ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                  *)&local_298,&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208.name._M_dataplus._M_p != &local_208.name.field_2) {
        operator_delete(local_208.name._M_dataplus._M_p,
                        (ulong)(local_208.name.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_dataplus._M_p != &local_358.field_2) {
        operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_318._0_8_ != (pointer)(local_318 + 0x10)) {
        operator_delete((void *)local_318._0_8_,(ulong)(local_318._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_258,"u_light",&local_2d8);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_258);
      local_318._0_8_ = local_318 + 0x10;
      pAVar8 = (pointer)(plVar5 + 2);
      if ((pointer)*plVar5 == pAVar8) {
        local_318._16_8_ = (pAVar8->name)._M_dataplus._M_p;
        local_318._24_8_ = plVar5[3];
      }
      else {
        local_318._16_8_ = (pAVar8->name)._M_dataplus._M_p;
        local_318._0_8_ = (pointer)*plVar5;
      }
      local_318._8_8_ = plVar5[1];
      *plVar5 = (long)pAVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append(local_318,(ulong)local_278._M_dataplus._M_p);
      local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
      psVar9 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_358.field_2._M_allocated_capacity = *psVar9;
        local_358.field_2._8_8_ = plVar5[3];
      }
      else {
        local_358.field_2._M_allocated_capacity = *psVar9;
        local_358._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_358._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_208.name._M_dataplus._M_p = (pointer)&local_208.name.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_208,local_358._M_dataplus._M_p,
                 local_358._M_dataplus._M_p + local_358._M_string_length);
      local_208.type = TYPE_VEC3;
      local_208.value.m_data[0] = 0.2;
      local_208.value.m_data[1] = 0.3;
      local_208.value.m_data[2] = 0.4;
      local_208.value.m_data[0xb] = 0.0;
      local_208.value.m_data[0xc] = 0.0;
      local_208.value.m_data[0xd] = 0.0;
      local_208.value.m_data[0xe] = 0.0;
      local_208.value.m_data[7] = 0.0;
      local_208.value.m_data[8] = 0.0;
      local_208.value.m_data[9] = 0.0;
      local_208.value.m_data[10] = 0.0;
      local_208.value.m_data[3] = 0.0;
      local_208.value.m_data[4] = 0.0;
      local_208.value.m_data[5] = 0.0;
      local_208.value.m_data[6] = 0.0;
      local_208.value.m_data[0xf] = 0.0;
      std::
      vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
      ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
                ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                  *)&local_298,&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208.name._M_dataplus._M_p != &local_208.name.field_2) {
        operator_delete(local_208.name._M_dataplus._M_p,
                        (ulong)(local_208.name.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_dataplus._M_p != &local_358.field_2) {
        operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_318._0_8_ != (pointer)(local_318 + 0x10)) {
        operator_delete((void *)local_318._0_8_,(ulong)(local_318._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if (local_8c == LIGHT_POINT) {
        std::operator+(&local_258,"u_light",&local_2d8);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_258);
        local_318._0_8_ = local_318 + 0x10;
        pAVar8 = (pointer)(plVar5 + 2);
        if ((pointer)*plVar5 == pAVar8) {
          local_318._16_8_ = (pAVar8->name)._M_dataplus._M_p;
          local_318._24_8_ = plVar5[3];
        }
        else {
          local_318._16_8_ = (pAVar8->name)._M_dataplus._M_p;
          local_318._0_8_ = (pointer)*plVar5;
        }
        local_318._8_8_ = plVar5[1];
        *plVar5 = (long)pAVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   (local_318,(ulong)local_278._M_dataplus._M_p);
        local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
        psVar9 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_358.field_2._M_allocated_capacity = *psVar9;
          local_358.field_2._8_8_ = plVar5[3];
        }
        else {
          local_358.field_2._M_allocated_capacity = *psVar9;
          local_358._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_358._M_string_length = plVar5[1];
        *plVar5 = (long)psVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        local_208.name._M_dataplus._M_p = (pointer)&local_208.name.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_208,local_358._M_dataplus._M_p,
                   local_358._M_dataplus._M_p + local_358._M_string_length);
        local_208.type = TYPE_VEC4;
        local_208.value.m_data[0] = 1.0;
        local_208.value.m_data[1] = 0.6;
        local_208.value.m_data[2] = 0.3;
        local_208.value.m_data[3] = 0.2;
        local_208.value.m_data[0xc] = 0.0;
        local_208.value.m_data[0xd] = 0.0;
        local_208.value.m_data[0xe] = 0.0;
        local_208.value.m_data[0xf] = 0.0;
        local_208.value.m_data[8] = 0.0;
        local_208.value.m_data[9] = 0.0;
        local_208.value.m_data[10] = 0.0;
        local_208.value.m_data[0xb] = 0.0;
        local_208.value.m_data[4] = 0.0;
        local_208.value.m_data[5] = 0.0;
        local_208.value.m_data[6] = 0.0;
        local_208.value.m_data[7] = 0.0;
        std::
        vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
        ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
                  ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                    *)&local_298,&local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208.name._M_dataplus._M_p != &local_208.name.field_2) {
          operator_delete(local_208.name._M_dataplus._M_p,
                          (ulong)(local_208.name.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) {
          operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_318._0_8_ != (pointer)(local_318 + 0x10)) {
          operator_delete((void *)local_318._0_8_,(ulong)(local_318._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_258,"u_light",&local_2d8);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_258);
        local_318._0_8_ = local_318 + 0x10;
        pAVar8 = (pointer)(plVar5 + 2);
        if ((pointer)*plVar5 == pAVar8) {
          local_318._16_8_ = (pAVar8->name)._M_dataplus._M_p;
          local_318._24_8_ = plVar5[3];
        }
        else {
          local_318._16_8_ = (pAVar8->name)._M_dataplus._M_p;
          local_318._0_8_ = (pointer)*plVar5;
        }
        local_318._8_8_ = plVar5[1];
        *plVar5 = (long)pAVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   (local_318,(ulong)local_278._M_dataplus._M_p);
        local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
        psVar9 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_358.field_2._M_allocated_capacity = *psVar9;
          local_358.field_2._8_8_ = plVar5[3];
        }
        else {
          local_358.field_2._M_allocated_capacity = *psVar9;
          local_358._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_358._M_string_length = plVar5[1];
        *plVar5 = (long)psVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        local_208.name._M_dataplus._M_p = (pointer)&local_208.name.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_208,local_358._M_dataplus._M_p,
                   local_358._M_dataplus._M_p + local_358._M_string_length);
        local_208.type = TYPE_FLOAT;
        lVar11 = 9;
        do {
          pfVar1 = local_208.value.m_data + lVar11 + -9;
          pfVar1[0] = 0.6;
          pfVar1[1] = 0.6;
          pfVar1 = local_208.value.m_data + lVar11 + -7;
          pfVar1[0] = 0.6;
          pfVar1[1] = 0.6;
          lVar11 = lVar11 + 4;
        } while (lVar11 != 0x19);
        std::
        vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
        ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
                  ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                    *)&local_298,&local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208.name._M_dataplus._M_p != &local_208.name.field_2) {
          operator_delete(local_208.name._M_dataplus._M_p,
                          (ulong)(local_208.name.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) {
          operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_318._0_8_ != (pointer)(local_318 + 0x10)) {
          operator_delete((void *)local_318._0_8_,(ulong)(local_318._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_258,"u_light",&local_2d8);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_258);
        local_318._0_8_ = local_318 + 0x10;
        pAVar8 = (pointer)(plVar5 + 2);
        if ((pointer)*plVar5 == pAVar8) {
          local_318._16_8_ = (pAVar8->name)._M_dataplus._M_p;
          local_318._24_8_ = plVar5[3];
        }
        else {
          local_318._16_8_ = (pAVar8->name)._M_dataplus._M_p;
          local_318._0_8_ = (pointer)*plVar5;
        }
        local_318._8_8_ = plVar5[1];
        *plVar5 = (long)pAVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   (local_318,(ulong)local_278._M_dataplus._M_p);
        local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
        psVar9 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_358.field_2._M_allocated_capacity = *psVar9;
          local_358.field_2._8_8_ = plVar5[3];
        }
        else {
          local_358.field_2._M_allocated_capacity = *psVar9;
          local_358._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_358._M_string_length = plVar5[1];
        *plVar5 = (long)psVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        local_208.name._M_dataplus._M_p = (pointer)&local_208.name.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_208,local_358._M_dataplus._M_p,
                   local_358._M_dataplus._M_p + local_358._M_string_length);
        local_208.type = TYPE_FLOAT;
        lVar11 = 9;
        do {
          *(undefined1 **)(local_208.value.m_data + lVar11 + -9) = &DAT_3f0000003f000000;
          *(undefined1 **)(local_208.value.m_data + lVar11 + -7) = &DAT_3f0000003f000000;
          lVar11 = lVar11 + 4;
        } while (lVar11 != 0x19);
        std::
        vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
        ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
                  ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                    *)&local_298,&local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208.name._M_dataplus._M_p != &local_208.name.field_2) {
          operator_delete(local_208.name._M_dataplus._M_p,
                          (ulong)(local_208.name.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) {
          operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_318._0_8_ != (pointer)(local_318 + 0x10)) {
          operator_delete((void *)local_318._0_8_,(ulong)(local_318._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_258,"u_light",&local_2d8);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_258);
        local_318._0_8_ = local_318 + 0x10;
        pAVar8 = (pointer)(plVar5 + 2);
        if ((pointer)*plVar5 == pAVar8) {
          local_318._16_8_ = (pAVar8->name)._M_dataplus._M_p;
          local_318._24_8_ = plVar5[3];
        }
        else {
          local_318._16_8_ = (pAVar8->name)._M_dataplus._M_p;
          local_318._0_8_ = (pointer)*plVar5;
        }
        local_318._8_8_ = plVar5[1];
        *plVar5 = (long)pAVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   (local_318,(ulong)local_278._M_dataplus._M_p);
        local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
        psVar9 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_358.field_2._M_allocated_capacity = *psVar9;
          local_358.field_2._8_8_ = plVar5[3];
        }
        else {
          local_358.field_2._M_allocated_capacity = *psVar9;
          local_358._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_358._M_string_length = plVar5[1];
        *plVar5 = (long)psVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        local_208.name._M_dataplus._M_p = (pointer)&local_208.name.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_208,local_358._M_dataplus._M_p,
                   local_358._M_dataplus._M_p + local_358._M_string_length);
        local_208.type = TYPE_FLOAT;
        lVar11 = 9;
        do {
          pfVar1 = local_208.value.m_data + lVar11 + -9;
          pfVar1[0] = 0.4;
          pfVar1[1] = 0.4;
          pfVar1 = local_208.value.m_data + lVar11 + -7;
          pfVar1[0] = 0.4;
          pfVar1[1] = 0.4;
          lVar11 = lVar11 + 4;
        } while (lVar11 != 0x19);
        std::
        vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
        ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
                  ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                    *)&local_298,&local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208.name._M_dataplus._M_p != &local_208.name.field_2) {
          operator_delete(local_208.name._M_dataplus._M_p,
                          (ulong)(local_208.name.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) {
          operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_318._0_8_ != (pointer)(local_318 + 0x10)) {
          operator_delete((void *)local_318._0_8_,(ulong)(local_318._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 != local_20c);
  }
  pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318;
  std::operator+(pbVar15,"u_mvpMatrix",&local_278);
  local_328 = 0;
  uStack_320 = 0;
  local_338 = 0;
  uStack_330 = 0;
  local_358.field_2._M_allocated_capacity = 0;
  local_358.field_2._8_8_ = 0;
  local_358._M_dataplus._M_p = (pointer)0x0;
  local_358._M_string_length = 0;
  lVar11 = 0;
  lVar10 = 0;
  do {
    lVar13 = 0;
    do {
      uVar19 = 0x3f800000;
      if (lVar11 != lVar13) {
        uVar19 = 0;
      }
      *(undefined4 *)((long)&(pbVar7->_M_dataplus)._M_p + lVar13) = uVar19;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x40);
    lVar10 = lVar10 + 1;
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&(pbVar7->_M_dataplus)._M_p + 4);
    lVar11 = lVar11 + 0x10;
  } while (lVar10 != 4);
  lVar11 = 0;
  do {
    uVar3 = *(undefined8 *)((long)&local_358._M_string_length + lVar11);
    *(undefined8 *)((long)&local_2d8._M_dataplus._M_p + lVar11) =
         *(undefined8 *)((long)&local_358._M_dataplus._M_p + lVar11);
    *(undefined8 *)((long)&local_2d8._M_string_length + lVar11) = uVar3;
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x40);
  local_208.name._M_dataplus._M_p = (pointer)&local_208.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_318._0_8_,
             (pointer)(local_318._0_8_ +
                      (long)((Vector<float,_16> *)(local_318._8_8_ + 0x20) + -1) + 0x20));
  local_208.type = TYPE_MAT4;
  local_208.value.m_data[0] = SUB84(local_2d8._M_dataplus._M_p,0);
  local_208.value.m_data[1] = (float)((ulong)local_2d8._M_dataplus._M_p >> 0x20);
  local_208.value.m_data[2] = (float)local_2d8._M_string_length;
  local_208.value.m_data[3] = (float)(local_2d8._M_string_length >> 0x20);
  local_208.value.m_data[4] = (float)local_2d8.field_2._M_allocated_capacity;
  local_208.value.m_data[5] = (float)((ulong)local_2d8.field_2._0_8_ >> 0x20);
  local_208.value.m_data[6] = (float)local_2d8.field_2._8_8_;
  local_208.value.m_data[7] = (float)((ulong)local_2d8.field_2._8_8_ >> 0x20);
  local_208.value.m_data[8] = (float)local_2b8;
  local_208.value.m_data[9] = (float)((ulong)local_2b8 >> 0x20);
  local_208.value.m_data[10] = (float)uStack_2b0;
  local_208.value.m_data[0xb] = (float)((ulong)uStack_2b0 >> 0x20);
  local_208.value.m_data[0xc] = (float)local_2a8;
  local_208.value.m_data[0xd] = (float)((ulong)local_2a8 >> 0x20);
  local_208.value.m_data[0xe] = (float)uStack_2a0;
  local_208.value.m_data[0xf] = (float)((ulong)uStack_2a0 >> 0x20);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
              *)&local_298,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.name._M_dataplus._M_p != &local_208.name.field_2) {
    operator_delete(local_208.name._M_dataplus._M_p,
                    (ulong)(local_208.name.field_2._M_allocated_capacity + 1));
  }
  if ((pointer)local_318._0_8_ != (pointer)(local_318 + 0x10)) {
    operator_delete((void *)local_318._0_8_,(ulong)(local_318._16_8_ + 1));
  }
  pbVar7 = &local_258;
  std::operator+(pbVar7,"u_modelViewMatrix",&local_278);
  local_2e8 = 0.0;
  fStack_2e4 = 0.0;
  uStack_2e0 = 0;
  local_2f8 = 0.0;
  fStack_2f4 = 0.0;
  uStack_2f0 = 0;
  local_318._16_8_ = (pointer)0x0;
  local_318._24_8_ = 0;
  local_318._0_8_ = (pointer)0x0;
  local_318._8_8_ = (pointer)0x0;
  lVar11 = 0;
  lVar10 = 0;
  do {
    lVar13 = 0;
    do {
      uVar19 = 0x3f800000;
      if (lVar11 != lVar13) {
        uVar19 = 0;
      }
      *(undefined4 *)((long)&(pbVar15->_M_dataplus)._M_p + lVar13) = uVar19;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x40);
    lVar10 = lVar10 + 1;
    pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&(pbVar15->_M_dataplus)._M_p + 4);
    lVar11 = lVar11 + 0x10;
  } while (lVar10 != 4);
  lVar11 = 0;
  do {
    uVar3 = *(undefined8 *)(local_318 + lVar11 + 8);
    *(undefined8 *)((long)&local_358._M_dataplus._M_p + lVar11) =
         *(undefined8 *)(local_318 + lVar11);
    *(undefined8 *)((long)&local_358._M_string_length + lVar11) = uVar3;
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x40);
  local_208.name._M_dataplus._M_p = (pointer)&local_208.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_258._M_dataplus._M_p,
             local_258._M_dataplus._M_p +
             (long)((Vector<float,_16> *)(local_258._M_string_length + 0x20) + -1) + 0x20);
  local_208.type = TYPE_MAT4;
  local_208.value.m_data[0] = SUB84(local_358._M_dataplus._M_p,0);
  local_208.value.m_data[1] = (float)((ulong)local_358._M_dataplus._M_p >> 0x20);
  local_208.value.m_data[2] = (float)local_358._M_string_length;
  local_208.value.m_data[3] = (float)(local_358._M_string_length >> 0x20);
  local_208.value.m_data[4] = (float)local_358.field_2._M_allocated_capacity;
  local_208.value.m_data[5] = (float)((ulong)local_358.field_2._0_8_ >> 0x20);
  local_208.value.m_data[6] = (float)local_358.field_2._8_8_;
  local_208.value.m_data[7] = (float)((ulong)local_358.field_2._8_8_ >> 0x20);
  local_208.value.m_data[8] = (float)local_338;
  local_208.value.m_data[9] = (float)((ulong)local_338 >> 0x20);
  local_208.value.m_data[10] = (float)uStack_330;
  local_208.value.m_data[0xb] = (float)((ulong)uStack_330 >> 0x20);
  local_208.value.m_data[0xc] = (float)local_328;
  local_208.value.m_data[0xd] = (float)((ulong)local_328 >> 0x20);
  local_208.value.m_data[0xe] = (float)uStack_320;
  local_208.value.m_data[0xf] = (float)((ulong)uStack_320 >> 0x20);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
              *)&local_298,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.name._M_dataplus._M_p != &local_208.name.field_2) {
    operator_delete(local_208.name._M_dataplus._M_p,
                    (ulong)(local_208.name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_58,"u_normalMatrix",&local_278);
  puVar6 = local_88;
  local_78._M_allocated_capacity = 0;
  local_78._8_8_ = 0;
  local_88 = ZEXT816(0);
  local_68 = 0;
  lVar11 = 0;
  lVar10 = 0;
  do {
    lVar13 = 0;
    auVar16 = _DAT_019fcc00;
    do {
      bVar18 = SUB164(auVar16 ^ _DAT_019f5ce0,4) == DAT_01a45900._4_4_ &&
               SUB164(auVar16 ^ _DAT_019f5ce0,0) < DAT_01a45900;
      if (bVar18) {
        uVar19 = 0x3f800000;
        if (lVar11 != lVar13) {
          uVar19 = 0;
        }
        *(undefined4 *)(puVar6 + lVar13) = uVar19;
      }
      if (bVar18) {
        uVar19 = 0x3f800000;
        if (lVar11 + -0xc != lVar13) {
          uVar19 = 0;
        }
        *(undefined4 *)(puVar6 + lVar13 + 0xc) = uVar19;
      }
      lVar17 = auVar16._8_8_;
      auVar16._0_8_ = auVar16._0_8_ + 2;
      auVar16._8_8_ = lVar17 + 2;
      lVar13 = lVar13 + 0x18;
    } while (lVar13 != 0x30);
    lVar10 = lVar10 + 1;
    lVar11 = lVar11 + 0xc;
    puVar6 = puVar6 + 4;
  } while (lVar10 != 3);
  puVar6 = local_88;
  lVar11 = 0;
  do {
    lVar10 = 0;
    do {
      *(undefined4 *)((long)&(pbVar7->_M_dataplus)._M_p + lVar10) = *(undefined4 *)(puVar6 + lVar10)
      ;
      lVar10 = lVar10 + 4;
    } while (lVar10 != 0xc);
    lVar11 = lVar11 + 1;
    puVar6 = puVar6 + 0xc;
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&pbVar7->_M_string_length + 4);
  } while (lVar11 != 3);
  fStack_2e4 = 0.0;
  uStack_2e0 = 0;
  fStack_2f4 = 0.0;
  uStack_2f0 = 0;
  local_2e8 = 0.0;
  local_318._0_8_ = local_258._M_dataplus._M_p;
  local_318._8_8_ = local_258._M_string_length;
  local_318._16_8_ = local_258.field_2._M_allocated_capacity;
  local_318._24_8_ = local_258.field_2._8_8_;
  local_2f8 = (float)local_238;
  local_208.name._M_dataplus._M_p = (pointer)&local_208.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_58._M_dataplus._M_p,
             local_58._M_dataplus._M_p + local_58._M_string_length);
  local_208.type = TYPE_MAT3;
  local_208.value.m_data[0] = (float)local_318._0_8_;
  local_208.value.m_data[1] = SUB84(local_318._0_8_,4);
  local_208.value.m_data[2] = (float)local_318._8_8_;
  local_208.value.m_data[3] = SUB84(local_318._8_8_,4);
  local_208.value.m_data[4] = (float)local_318._16_8_;
  local_208.value.m_data[5] = SUB84(local_318._16_8_,4);
  local_208.value.m_data[6] = (float)local_318._24_8_;
  local_208.value.m_data[7] = SUB84(local_318._24_8_,4);
  local_208.value.m_data[8] = local_2f8;
  local_208.value.m_data[9] = fStack_2f4;
  local_208.value.m_data[10] = (float)uStack_2f0;
  local_208.value.m_data[0xb] = (float)((ulong)uStack_2f0 >> 0x20);
  local_208.value.m_data[0xc] = local_2e8;
  local_208.value.m_data[0xd] = fStack_2e4;
  local_208.value.m_data[0xe] = (float)uStack_2e0;
  local_208.value.m_data[0xf] = (float)((ulong)uStack_2e0 >> 0x20);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
              *)&local_298,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.name._M_dataplus._M_p != &local_208.name.field_2) {
    operator_delete(local_208.name._M_dataplus._M_p,
                    (ulong)(local_208.name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 "u_texCoordMatrix0",&local_278);
  pbVar7 = &local_258;
  local_228 = 0;
  uStack_220 = 0;
  local_238 = 0;
  uStack_230 = 0;
  local_258.field_2._M_allocated_capacity = 0;
  local_258.field_2._8_8_ = 0;
  local_258._M_dataplus._M_p = (pointer)0x0;
  local_258._M_string_length = 0;
  lVar11 = 0;
  lVar10 = 0;
  do {
    lVar13 = 0;
    do {
      uVar19 = 0x3f800000;
      if (lVar11 != lVar13) {
        uVar19 = 0;
      }
      *(undefined4 *)((long)&(pbVar7->_M_dataplus)._M_p + lVar13) = uVar19;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x40);
    lVar10 = lVar10 + 1;
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&(pbVar7->_M_dataplus)._M_p + 4);
    lVar11 = lVar11 + 0x10;
  } while (lVar10 != 4);
  lVar11 = 0;
  do {
    uVar3 = *(undefined8 *)((long)&local_258._M_string_length + lVar11);
    *(undefined8 *)(local_318 + lVar11) =
         *(undefined8 *)((long)&local_258._M_dataplus._M_p + lVar11);
    *(undefined8 *)(local_318 + lVar11 + 8) = uVar3;
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x40);
  local_208.name._M_dataplus._M_p = (pointer)&local_208.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_88._0_8_,(pointer)(local_88._0_8_ + local_88._8_8_));
  local_208.type = TYPE_MAT4;
  local_208.value.m_data[0] = (float)local_318._0_8_;
  local_208.value.m_data[1] = SUB84(local_318._0_8_,4);
  local_208.value.m_data[2] = (float)local_318._8_8_;
  local_208.value.m_data[3] = SUB84(local_318._8_8_,4);
  local_208.value.m_data[4] = (float)local_318._16_8_;
  local_208.value.m_data[5] = SUB84(local_318._16_8_,4);
  local_208.value.m_data[6] = (float)local_318._24_8_;
  local_208.value.m_data[7] = SUB84(local_318._24_8_,4);
  local_208.value.m_data[8] = local_2f8;
  local_208.value.m_data[9] = fStack_2f4;
  local_208.value.m_data[10] = (float)uStack_2f0;
  local_208.value.m_data[0xb] = (float)((ulong)uStack_2f0 >> 0x20);
  local_208.value.m_data[0xc] = local_2e8;
  local_208.value.m_data[0xd] = fStack_2e4;
  local_208.value.m_data[0xe] = (float)uStack_2e0;
  local_208.value.m_data[0xf] = (float)((ulong)uStack_2e0 >> 0x20);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
              *)&local_298,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.name._M_dataplus._M_p != &local_208.name.field_2) {
    operator_delete(local_208.name._M_dataplus._M_p,
                    (ulong)(local_208.name.field_2._M_allocated_capacity + 1));
  }
  if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
    operator_delete((void *)local_88._0_8_,local_78._M_allocated_capacity + 1);
  }
  std::operator+(&local_258,"u_sampler0",&local_278);
  local_208.name._M_dataplus._M_p = (pointer)&local_208.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_258._M_dataplus._M_p,
             local_258._M_dataplus._M_p + local_258._M_string_length);
  local_208.type = TYPE_TEXTURE_UNIT;
  local_208.value.m_data[0] = 0.0;
  local_208.value.m_data[1] = 0.0;
  local_208.value.m_data[2] = 0.0;
  local_208.value.m_data[3] = 0.0;
  local_208.value.m_data[4] = 0.0;
  local_208.value.m_data[5] = 0.0;
  local_208.value.m_data[6] = 0.0;
  local_208.value.m_data[7] = 0.0;
  local_208.value.m_data[8] = 0.0;
  local_208.value.m_data[9] = 0.0;
  local_208.value.m_data[10] = 0.0;
  local_208.value.m_data[0xb] = 0.0;
  local_208.value.m_data[0xc] = 0.0;
  local_208.value.m_data[0xd] = 0.0;
  local_208.value.m_data[0xe] = 0.0;
  local_208.value.m_data[0xf] = 0.0;
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>
            ((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
              *)&local_298,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.name._M_dataplus._M_p != &local_208.name.field_2) {
    operator_delete(local_208.name._M_dataplus._M_p,
                    (ulong)(local_208.name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  local_208.name.field_2._M_allocated_capacity =
       (size_type)
       (__return_storage_ptr__->uniforms).
       super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_298.field_2._M_allocated_capacity;
  local_208.name._M_dataplus._M_p =
       (pointer)(__return_storage_ptr__->uniforms).
                super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_208.name._M_string_length =
       (size_type)
       (__return_storage_ptr__->uniforms).
       super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_298._M_dataplus._M_p;
  (__return_storage_ptr__->uniforms).
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_298._M_string_length;
  local_298._M_dataplus._M_p = (pointer)0x0;
  local_298._M_string_length = 0;
  local_298.field_2._M_allocated_capacity = 0;
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::~vector((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
             *)&local_208);
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
  ::~vector((vector<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::UniformSpec>_>
             *)&local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

ShaderCompilerCase::ProgramContext ShaderCompilerLightCase::generateShaderData (int measurementNdx) const
{
	deUint32		specID		= getSpecializationID(measurementNdx);
	string			nameSpec	= getNameSpecialization(specID);
	ProgramContext	result;

	result.vertShaderSource		= specializeShaderSource(lightVertexTemplate(m_numLights, m_isVertexCase, m_lightType), specID, SHADER_VALIDITY_VALID);
	result.fragShaderSource		= specializeShaderSource(lightFragmentTemplate(m_numLights, m_isVertexCase, m_lightType), specID, SHADER_VALIDITY_VALID);
	result.vertexAttributes		= lightShaderAttributes(nameSpec);
	result.uniforms				= lightShaderUniforms(nameSpec, m_numLights, m_lightType);

	return result;
}